

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_t max;
  char *pcVar6;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  byte *pbVar12;
  uint uVar13;
  byte *__s2;
  curl_slist *pcVar14;
  CURLcode CVar15;
  bool bVar16;
  bool bVar17;
  char *local_40;
  curl_slist *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  do {
    pcVar11 = conn_to_host->data;
    local_38 = conn_to_host;
    if (*pcVar11 == ':') {
      pcVar11 = pcVar11 + 1;
      bVar16 = true;
LAB_004c662d:
      if (bVar16) {
        if (*pcVar11 != ':') {
          pcVar6 = strchr(pcVar11,0x3a);
          if (pcVar6 != (char *)0x0) {
            local_40 = (char *)0x0;
            lVar7 = strtol(pcVar11,&local_40,10);
            if (local_40 == pcVar6) {
              bVar17 = lVar7 == conn->remote_port;
              if (bVar17) {
                pcVar11 = pcVar6 + 1;
              }
              goto LAB_004c667f;
            }
          }
          goto LAB_004c667d;
        }
        bVar17 = true;
        pcVar11 = pcVar11 + 1;
      }
      else {
LAB_004c667d:
        bVar17 = false;
      }
LAB_004c667f:
      pcVar14 = local_38;
      bVar4 = true;
      uVar13 = 0xffffffff;
      if (!bVar16) {
        CVar15 = CURLE_OK;
        bVar4 = true;
        goto LAB_004c679c;
      }
      if ((bVar17) && (*pcVar11 != '\0')) {
        pbVar8 = (byte *)(*Curl_cstrdup)(pcVar11);
        if (pbVar8 == (byte *)0x0) {
          CVar15 = CURLE_OUT_OF_MEMORY;
          pcVar11 = (char *)0x0;
          bVar4 = false;
        }
        else {
          pbVar12 = pbVar8;
          __s2 = pbVar8;
          if (*pbVar8 == 0x5b) {
            bVar3 = pbVar8[1];
            pbVar12 = pbVar8 + 1;
            for (__s2 = pbVar12;
                (bVar3 != 0 &&
                (((iVar5 = Curl_isxdigit((uint)bVar3), iVar5 != 0 || (*__s2 == 0x3a)) ||
                 (*__s2 == 0x2e)))); __s2 = __s2 + 1) {
              bVar3 = __s2[1];
            }
            if (*__s2 == 0x25) {
              iVar5 = strncmp("%25",(char *)__s2,3);
              if (iVar5 != 0) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
              }
              do {
                pbVar1 = __s2 + 1;
                __s2 = __s2 + 1;
                if (*pbVar1 == 0) break;
                iVar5 = Curl_isalpha((uint)*pbVar1);
              } while (((iVar5 != 0) || (iVar5 = Curl_isxdigit((uint)*__s2), iVar5 != 0)) ||
                      ((bVar3 = *__s2, bVar3 - 0x2d < 2 || ((bVar3 == 0x7e || (bVar3 == 0x5f))))));
            }
            if (*__s2 == 0x5d) {
              *__s2 = 0;
              __s2 = __s2 + 1;
            }
            else {
              Curl_infof(data,"Invalid IPv6 address format\n");
            }
          }
          pcVar11 = strchr((char *)__s2,0x3a);
          if (pcVar11 == (char *)0x0) {
            uVar13 = 0xffffffff;
          }
          else {
            local_40 = (char *)0x0;
            *pcVar11 = '\0';
            uVar13 = 0xffffffff;
            if (pcVar11[1] != '\0') {
              uVar9 = strtol(pcVar11 + 1,&local_40,10);
              if (((local_40 == (char *)0x0) || (*local_40 == '\0')) && (uVar9 < 0x10000)) {
                uVar13 = (uint)uVar9;
              }
              else {
                Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar11 + 1)
                ;
                pbVar12 = (byte *)0x0;
              }
            }
          }
          bVar4 = true;
          if (pbVar12 == (byte *)0x0) {
            pcVar11 = (char *)0x0;
            CVar15 = CURLE_OK;
          }
          else {
            pcVar11 = (*Curl_cstrdup)((char *)pbVar12);
            CVar15 = CURLE_OK;
            if (pcVar11 == (char *)0x0) {
              CVar15 = CURLE_OUT_OF_MEMORY;
              uVar13 = 0xffffffff;
              bVar4 = false;
            }
          }
          (*Curl_cfree)(pbVar8);
        }
      }
      else {
        pcVar11 = (char *)0x0;
        CVar15 = CURLE_OK;
      }
    }
    else {
      bVar16 = (*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0;
      pcVar6 = "[";
      if (bVar16) {
        pcVar6 = "";
      }
      pcVar10 = "]";
      if (bVar16) {
        pcVar10 = "";
      }
      bVar16 = false;
      pcVar6 = curl_maprintf("%s%s%s",pcVar6,(conn->host).name,pcVar10);
      if (pcVar6 != (char *)0x0) {
        max = strlen(pcVar6);
        iVar5 = Curl_strncasecompare(pcVar11,pcVar6,max);
        (*Curl_cfree)(pcVar6);
        bVar16 = false;
        if (iVar5 != 0) {
          bVar16 = pcVar11[max] == ':';
        }
        pcVar11 = pcVar11 + max + 1;
      }
      if (pcVar6 != (char *)0x0) goto LAB_004c662d;
      CVar15 = CURLE_OUT_OF_MEMORY;
      bVar4 = false;
LAB_004c679c:
      pcVar11 = (char *)0x0;
      uVar13 = 0xffffffff;
      pcVar14 = local_38;
    }
    if (!bVar4) {
      return CVar15;
    }
    if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
      puVar2 = &(conn->bits).field_0x4;
      *puVar2 = *puVar2 & 0xfb;
      (*Curl_cfree)(pcVar11);
      bVar16 = true;
    }
    else {
      (conn->conn_to_host).rawalloc = pcVar11;
      (conn->conn_to_host).name = pcVar11;
      puVar2 = &(conn->bits).field_0x4;
      *puVar2 = *puVar2 | 4;
      bVar16 = false;
      Curl_infof(data,"Connecting to hostname: %s\n",pcVar11);
    }
    if ((int)uVar13 < 0) {
      puVar2 = &(conn->bits).field_0x4;
      *puVar2 = *puVar2 & 0xf7;
    }
    else {
      conn->conn_to_port = uVar13;
      puVar2 = &(conn->bits).field_0x4;
      *puVar2 = *puVar2 | 8;
      Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar13);
    }
    conn_to_host = pcVar14->next;
    if (!bVar16 || conn_to_host == (curl_slist *)0x0) {
      return CURLE_OK;
    }
    if (-1 < (int)uVar13) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifdef USE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     (conn->handler->protocol == CURLPROTO_HTTPS)) {
    /* no connect_to match, try alt-svc! */
    const char *nhost;
    int nport;
    enum alpnid nalpnid;
    bool hit;
    host = conn->host.rawalloc;
    hit = Curl_altsvc_lookup(data->asi,
                             ALPN_h1, host, conn->remote_port, /* from */
                             &nalpnid, &nhost, &nport /* to */);
    if(hit) {
      char *hostd = strdup((char *)nhost);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = nport;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d\n",
            Curl_alpnid2str(ALPN_h1), host, conn->remote_port,
            Curl_alpnid2str(nalpnid), hostd, nport);
    }
  }
#endif

  return result;
}